

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O0

ngx_listening_t * ngx_create_listening(ngx_conf_t *cf,sockaddr *sockaddr,socklen_t socklen)

{
  short sVar1;
  ngx_conf_file_t *pnVar2;
  u_char local_b8 [8];
  u_char text [113];
  sockaddr *sa;
  ngx_listening_t *ls;
  size_t len;
  socklen_t socklen_local;
  sockaddr *sockaddr_local;
  ngx_conf_t *cf_local;
  
  cf_local = (ngx_conf_t *)ngx_array_push(&cf->cycle->listening);
  if (cf_local == (ngx_conf_t *)0x0) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    memset(cf_local,0,0xe0);
    register0x00000000 = (ngx_array_t *)ngx_palloc(cf->pool,(ulong)socklen);
    if (register0x00000000 == (ngx_array_t *)0x0) {
      cf_local = (ngx_conf_t *)0x0;
    }
    else {
      memcpy(register0x00000000,sockaddr,(ulong)socklen);
      cf_local->args = stack0xffffffffffffffc0;
      *(socklen_t *)&cf_local->cycle = socklen;
      ls = (ngx_listening_t *)
           ngx_sock_ntop((sockaddr *)stack0xffffffffffffffc0,socklen,local_b8,0x71,1);
      cf_local->temp_pool = (ngx_pool_t *)ls;
      sVar1 = *(short *)&cf_local->args->elts;
      if (sVar1 == 1) {
        cf_local->pool = (ngx_pool_t *)0x71;
        ls = (ngx_listening_t *)((long)&ls->fd + 1);
      }
      else if (sVar1 == 2) {
        cf_local->pool = (ngx_pool_t *)0xf;
      }
      else if (sVar1 == 10) {
        cf_local->pool = (ngx_pool_t *)0x2d;
      }
      else {
        cf_local->pool = (ngx_pool_t *)0x71;
      }
      pnVar2 = (ngx_conf_file_t *)ngx_pnalloc(cf->pool,(size_t)ls);
      cf_local->conf_file = pnVar2;
      if (cf_local->conf_file == (ngx_conf_file_t *)0x0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        memcpy(cf_local->conf_file,local_b8,(size_t)ls);
        *(undefined4 *)&cf_local->name = 0xffffffff;
        *(undefined4 *)&cf_local->log = 1;
        *(undefined4 *)((long)&cf_local->log + 4) = 0x1ff;
        *(undefined4 *)&cf_local->ctx = 0xffffffff;
        *(undefined4 *)((long)&cf_local->ctx + 4) = 0xffffffff;
        *(undefined4 *)((long)&cf_local[2].pool + 4) = 0xffffffff;
      }
    }
  }
  return (ngx_listening_t *)cf_local;
}

Assistant:

ngx_listening_t *
ngx_create_listening(ngx_conf_t *cf, struct sockaddr *sockaddr,
    socklen_t socklen)
{
    size_t            len;
    ngx_listening_t  *ls;
    struct sockaddr  *sa;
    u_char            text[NGX_SOCKADDR_STRLEN];

    ls = ngx_array_push(&cf->cycle->listening);
    if (ls == NULL) {
        return NULL;
    }

    ngx_memzero(ls, sizeof(ngx_listening_t));

    sa = ngx_palloc(cf->pool, socklen);
    if (sa == NULL) {
        return NULL;
    }

    ngx_memcpy(sa, sockaddr, socklen);

    ls->sockaddr = sa;
    ls->socklen = socklen;

    len = ngx_sock_ntop(sa, socklen, text, NGX_SOCKADDR_STRLEN, 1);
    ls->addr_text.len = len;

    switch (ls->sockaddr->sa_family) {
#if (NGX_HAVE_INET6)
    case AF_INET6:
        ls->addr_text_max_len = NGX_INET6_ADDRSTRLEN;
        break;
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:
        ls->addr_text_max_len = NGX_UNIX_ADDRSTRLEN;
        len++;
        break;
#endif
    case AF_INET:
        ls->addr_text_max_len = NGX_INET_ADDRSTRLEN;
        break;
    default:
        ls->addr_text_max_len = NGX_SOCKADDR_STRLEN;
        break;
    }

    ls->addr_text.data = ngx_pnalloc(cf->pool, len);
    if (ls->addr_text.data == NULL) {
        return NULL;
    }

    ngx_memcpy(ls->addr_text.data, text, len);

    ls->fd = (ngx_socket_t) -1;
    ls->type = SOCK_STREAM;

    ls->backlog = NGX_LISTEN_BACKLOG;
    ls->rcvbuf = -1;
    ls->sndbuf = -1;

#if (NGX_HAVE_SETFIB)
    ls->setfib = -1;
#endif

#if (NGX_HAVE_TCP_FASTOPEN)
    ls->fastopen = -1;
#endif

    return ls;
}